

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockaddr.c
# Opt level: O3

char * nng_str_sockaddr(nng_sockaddr *sa,char *buf,size_t bufsz)

{
  ushort uVar1;
  ulong uVar2;
  size_t sVar3;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  bool bVar11;
  bool bVar12;
  char local_88 [56];
  ulong local_50;
  char *local_48;
  size_t local_40;
  uint local_38;
  uint32_t local_34;
  
  switch(sa->s_family) {
  case 1:
    pcVar10 = (sa->s_ipc).sa_path;
    pcVar7 = "inproc[%s]";
    break;
  case 2:
    pcVar10 = (sa->s_ipc).sa_path;
    pcVar7 = "%s";
    break;
  case 3:
    snprintf(buf,bufsz,"%u.%u.%u.%u:%u",(ulong)(sa->s_in6).sa_addr[0],(ulong)(sa->s_in6).sa_addr[1],
             (ulong)(sa->s_in6).sa_addr[2],(ulong)(sa->s_in6).sa_addr[3],
             (ulong)(ushort)((sa->s_in6).sa_port << 8 | (sa->s_in6).sa_port >> 8));
    return buf;
  case 4:
    local_34 = (sa->s_in6).sa_scope;
    local_48 = buf;
    local_40 = bufsz;
    if (*(int *)((sa->s_ipc).sa_path + 10) == -0x10000 && *(long *)((sa->s_ipc).sa_path + 2) == 0) {
      snprintf(local_88,0x2e,"::ffff:%u.%u.%u.%u",(ulong)(sa->s_in6).sa_addr[0xc],
               (ulong)(sa->s_in6).sa_addr[0xd],(ulong)(sa->s_in6).sa_addr[0xe],
               (ulong)(sa->s_in6).sa_addr[0xf]);
    }
    else {
      bVar6 = 0;
      uVar2 = 0;
      bVar4 = 0;
      uVar8 = 0;
      uVar5 = 0;
      do {
        if ((*(char *)((long)sa + uVar5 + 4) == '\0') && (*(char *)((long)sa + uVar5 + 5) == '\0'))
        {
          bVar4 = bVar4 + 2;
          uVar8 = uVar8 & 0xff;
          if (bVar4 == 2) {
            uVar8 = uVar5 & 0xffffffff;
          }
          uVar2 = uVar2 & 0xff;
          if (bVar6 < bVar4) {
            uVar2 = uVar8;
            bVar6 = bVar4;
          }
        }
        else {
          bVar4 = 0;
        }
        bVar11 = uVar5 < 0xe;
        uVar5 = uVar5 + 2;
      } while (bVar11);
      bVar4 = 0xff;
      if (1 < bVar6) {
        bVar4 = (byte)uVar2;
      }
      local_88[0] = '\0';
      local_50 = (ulong)bVar4;
      local_38 = (uint)bVar6 + (uint)bVar4;
      bVar11 = false;
      iVar9 = 0;
      uVar2 = 0;
      do {
        if (local_50 == uVar2) {
          if (0x2b < iVar9) {
            nni_panic("%s: %d: assert err: %s",
                      "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sockaddr.c"
                      ,0x55,"idx <= 43");
          }
          pcVar7 = local_88 + iVar9;
          sVar3 = strlen(pcVar7);
          (pcVar7 + sVar3)[0] = ':';
          (pcVar7 + sVar3)[1] = ':';
          pcVar7[sVar3 + 2] = '\0';
          iVar9 = iVar9 + 2;
          bVar11 = false;
        }
        else if ((uVar2 < local_50) || (local_38 <= (uint)uVar2)) {
          if (0x28 < iVar9) {
            nni_panic("%s: %d: assert err: %s",
                      "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sockaddr.c"
                      ,0x5c,"idx <= 40");
          }
          pcVar7 = "%x";
          if (bVar11) {
            pcVar7 = ":%x";
          }
          uVar1 = *(ushort *)((long)sa + uVar2 + 4);
          snprintf(local_88 + iVar9,6,pcVar7,(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
          sVar3 = strlen(local_88 + iVar9);
          iVar9 = (int)sVar3 + iVar9;
          bVar11 = true;
        }
        bVar12 = uVar2 < 0xe;
        uVar2 = uVar2 + 2;
      } while (bVar12);
    }
    pcVar7 = local_48;
    if (local_34 != 0) {
      snprintf(local_48,local_40,"[%s%%%u]:%u",local_88,(ulong)(sa->s_in6).sa_scope,
               (ulong)(ushort)((sa->s_in6).sa_port << 8 | (sa->s_in6).sa_port >> 8));
      return pcVar7;
    }
    snprintf(local_48,local_40,"[%s]:%u",local_88,
             (ulong)(ushort)((sa->s_in6).sa_port << 8 | (sa->s_in6).sa_port >> 8));
    return pcVar7;
  case 5:
    pcVar10 = (sa->s_ipc).sa_path + 2;
    pcVar7 = "abstract[%s]";
    break;
  default:
    return "unknown";
  }
  snprintf(buf,bufsz,pcVar7,pcVar10);
  return buf;
}

Assistant:

const char *
nng_str_sockaddr(const nng_sockaddr *sa, char *buf, size_t bufsz)
{
	switch (sa->s_family) {
	case NNG_AF_INPROC:
		return (str_sa_inproc(&sa->s_inproc, buf, bufsz));
	case NNG_AF_INET:
		return (str_sa_inet(&sa->s_in, buf, bufsz));
	case NNG_AF_INET6:
		return (str_sa_inet6(&sa->s_in6, buf, bufsz));
	case NNG_AF_IPC:
		return (str_sa_ipc(&sa->s_ipc, buf, bufsz));
	case NNG_AF_ABSTRACT:
		return (str_sa_abstract(&sa->s_abstract, buf, bufsz));
	case NNG_AF_UNSPEC:
	default:
		return ("unknown");
	}
}